

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_inline.h
# Opt level: O0

_Bool xdr_opaque_auth_encode(XDR *xdrs,opaque_auth *oa)

{
  _Bool _Var1;
  opaque_auth *oa_local;
  XDR *xdrs_local;
  
  _Var1 = xdr_putenum(xdrs,oa->oa_flavor);
  if (_Var1) {
    _Var1 = xdr_putuint32(xdrs,oa->oa_length);
    if (_Var1) {
      if (oa->oa_length == 0) {
        xdrs_local._7_1_ = true;
      }
      else {
        xdrs_local._7_1_ = xdr_opaque_auth_encode_it(xdrs,oa);
      }
    }
    else {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR oa_length","xdr_opaque_auth_encode",0x5b);
      }
      xdrs_local._7_1_ = false;
    }
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR oa_flavor","xdr_opaque_auth_encode",0x55);
    }
    xdrs_local._7_1_ = false;
  }
  return xdrs_local._7_1_;
}

Assistant:

static inline bool
xdr_opaque_auth_encode(XDR *xdrs, struct opaque_auth *oa)
{
	/*
	 * XDR_INLINE is just as likely to do a function call,
	 * so don't bother with it here.
	 */
	if (!xdr_putenum(xdrs, oa->oa_flavor)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_flavor",
			__func__, __LINE__);
		return (false);
	}
	if (!xdr_putuint32(xdrs, oa->oa_length)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_length",
			__func__, __LINE__);
		return (false);
	}

	if (oa->oa_length) {
		/* only call and alloc for > 0 length */
		return (xdr_opaque_auth_encode_it(xdrs, oa));
	}
	return (true);	/* 0 length succeeds */
}